

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPUsesAllocatorsClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPUsesAllocatorsClause *this)

{
  vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_> *this_00;
  bool bVar1;
  reference ppuVar2;
  uint uVar3;
  ulong __n;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"uses_allocators ",(allocator<char> *)&local_50);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__cxx11::string::append((char *)&local_50);
  this_00 = &this->usesAllocatorsAllocatorSequence;
  uVar3 = 0;
  do {
    __n = (ulong)uVar3;
    if ((ulong)((long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->usesAllocatorsAllocatorSequence).
                      super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
    ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                        (this_00,__n);
    switch((*ppuVar2)->allocator) {
    case OMPC_USESALLOCATORS_ALLOCATOR_default:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_large_cap:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_high_bw:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_low_lat:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_cgroup:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_pteam:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_thread:
      std::__cxx11::string::append((char *)&local_50);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    case OMPC_USESALLOCATORS_ALLOCATOR_user:
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string((string *)&local_70,(string *)&(*ppuVar2)->allocator_user);
      std::__cxx11::string::append((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::at
                          (this_00,__n);
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
      bVar1 = std::operator!=(&local_70,"");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        std::__cxx11::string::append((char *)&local_50);
        ppuVar2 = std::vector<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>::
                  at(this_00,__n);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(*ppuVar2)->allocator_traits_array);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::append((char *)&local_50);
      }
      break;
    default:
      goto switchD_0015fec6_default;
    }
    if (__n < ((long)(this->usesAllocatorsAllocatorSequence).
                     super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->usesAllocatorsAllocatorSequence).
                     super__Vector_base<usesAllocatorParameter_*,_std::allocator<usesAllocatorParameter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
      std::__cxx11::string::append((char *)&local_50);
    }
switchD_0015fec6_default:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string OpenMPUsesAllocatorsClause::toString() {
    std::vector<usesAllocatorParameter*>* usesAllocatorsAllocatorSequence = this->getUsesAllocatorsAllocatorSequence();
    std::string result = "uses_allocators ";
    std::string parameter_string;
    parameter_string += "(";
    for (unsigned int i = 0; i < usesAllocatorsAllocatorSequence->size(); i++) {
        switch (usesAllocatorsAllocatorSequence->at(i)->getUsesAllocatorsAllocator()) {
            case OMPC_USESALLOCATORS_ALLOCATOR_default: {
                parameter_string += "omp_default_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_large_cap: {
                parameter_string += "omp_large_cap_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cons_mem: {
                parameter_string += "omp_const_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_high_bw: {
                parameter_string += "omp_high_bw_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_low_lat: {
                parameter_string += "omp_low_lat_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_cgroup: {
                parameter_string += "omp_cgroup_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_pteam: {
                parameter_string += "omp_pteam_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_thread: {
                parameter_string += "omp_thread_mem_alloc";
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            case OMPC_USESALLOCATORS_ALLOCATOR_user: {
                parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorUser();
                if (usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray() != "") {
                    parameter_string += "(";
                    parameter_string += usesAllocatorsAllocatorSequence->at(i)->getAllocatorTraitsArray();
                    parameter_string += ")";
                }
                if (i < usesAllocatorsAllocatorSequence->size()-1) {
                    parameter_string += ",";
                }
            }
            break;
            default:
                   ;
    }
}
    result += parameter_string;
    result += " ) ";
    return result;
}